

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::thirdparty_messages(DebugMessageTestContext *ctx)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Messages with source of GL_DEBUG_SOURCE_THIRD_PARTY","");
  NegativeTestShared::NegativeTestContext::beginSection(&ctx->super_NegativeTestContext,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  emitMessages(ctx,0x8249);
  NegativeTestShared::NegativeTestContext::endSection(&ctx->super_NegativeTestContext);
  return;
}

Assistant:

void thirdparty_messages (DebugMessageTestContext& ctx)
{
	ctx.beginSection("Messages with source of GL_DEBUG_SOURCE_THIRD_PARTY");
	emitMessages(ctx, GL_DEBUG_SOURCE_THIRD_PARTY);
	ctx.endSection();
}